

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  uchar *pImage_data;
  Webcam usbcam;
  int actual_comps;
  ImgClass img;
  ImgClass jpge;
  ofstream image2;
  subsampling_t sStack_404;
  ofstream JPG_file;
  
  Webcam::Webcam(&usbcam,"/dev/video0",0xcc0,0x990);
  if (usbcam.isOpen == true) {
    Webcam::start(&usbcam);
    sleep(10);
    Webcam::getImg(&img,&usbcam);
    Webcam::stop(&usbcam);
    poVar1 = std::operator<<((ostream *)&std::cout,"getImg:");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"img.width:  ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.width);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"img.height: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.height);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"img.size:   ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.size);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ofstream::ofstream(&JPG_file);
    std::ofstream::open((char *)&JPG_file,0x116c72);
    std::ostream::write((char *)&JPG_file,(long)img.data);
    std::ofstream::close();
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_ef92);
    std::endl<char,std::char_traits<char>>(poVar1);
    pImage_data = jpgd::decompress_jpeg_image_from_memory
                            (img.data,img.size,&img.width,&img.height,&actual_comps,3);
    poVar1 = std::operator<<((ostream *)&std::cout,"actual_comps:");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,actual_comps);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_efbe);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"width  = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.width);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"height = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.height);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"size   = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,img.size);
    std::endl<char,std::char_traits<char>>(poVar1);
    ImgClass::ImgClass(&jpge,img.width,img.height,img.size);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_eff2);
    std::endl<char,std::char_traits<char>>(poVar1);
    _image2 = 0x32;
    sStack_404 = H2V2;
    ::jpge::compress_image_to_jpeg_file_in_memory
              (jpge.data,&jpge.size,jpge.width,jpge.height,actual_comps,pImage_data,
               (params *)&image2);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_effc);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"width  = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,jpge.width);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"height = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,jpge.height);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"size   = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,jpge.size);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ofstream::ofstream(&image2);
    std::ofstream::open((char *)&image2,0x116ce2);
    std::ostream::write((char *)&image2,(long)jpge.data);
    std::ofstream::close();
    free(pImage_data);
    poVar1 = std::operator<<((ostream *)&std::cout,"end");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ofstream::~ofstream(&image2);
    ImgClass::~ImgClass(&jpge);
    std::ofstream::~ofstream(&JPG_file);
    ImgClass::~ImgClass(&img);
  }
  Webcam::~Webcam(&usbcam);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    Webcam usbcam("/dev/video0", 3264, 2448);
    if(!usbcam.isOpen) {
        return 0;
    }

    //测试单帧拍摄模式
    //ImgClass img = usbcam.snap();

    //测试流模式
    usbcam.start();     //开启后台线程处理
    sleep(10);          //后台线程运行10s(用于测试帧率)
    ImgClass img = usbcam.getImg(); //获取流中最新的jpg图片
    usbcam.stop();      //关闭并停止拍摄线程

    cout<<"getImg:"<<endl;
    cout<<"img.width:  "<<img.width<<endl;
    cout<<"img.height: "<<img.height<<endl;
    cout<<"img.size:   "<<img.size<<endl;

    //原图保存到文件"1.jpg"
    ofstream JPG_file;
    const char *jpgFile = "1.jpg";
    JPG_file.open(jpgFile);
    JPG_file.write((char *)img.data, img.size);
    JPG_file.close();

    //jpg解码 img.data -->> imgData;
    int actual_comps;   //通道数
    cout<<"开始解码..."<<endl;
    unsigned char *imgData = decompress_jpeg_image_from_memory(img.data, img.size, &img.width, &img.height, &actual_comps, 3);
    cout<<"actual_comps:"<<actual_comps<<endl;
    cout<<"解码结束！"<<endl;
    cout<<"width  = "<<img.width<<endl;
    cout<<"height = "<<img.height<<endl;
    cout<<"size   = "<<img.size<<endl;

    //jpg压缩编码
    ImgClass jpge(img.width, img.height, img.size); //初始化图像信息 for compress_image_to_jpeg_file_in_memory()
    cout<<"开始编码..."<<endl;
    compress_image_to_jpeg_file_in_memory(jpge.data, jpge.size, jpge.width, jpge.height, actual_comps, imgData);
    cout<<"编码结束!"<<endl;
    cout<<"width  = "<<jpge.width<<endl;
    cout<<"height = "<<jpge.height<<endl;
    cout<<"size   = "<<jpge.size<<endl;

    //重新压缩后图像保存到文件"2.jpg"
    ofstream image2;
    image2.open("2.jpg");
    image2.write((char *)jpge.data, jpge.size);
    image2.close();

    free(imgData);

    cout<<"end"<<endl;
    return 0;
}